

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
::on_start(tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
           *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  string_t *this_00;
  element_type *peVar1;
  tag_t<cfgfile::string_trait_t> *p;
  undefined8 in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>
  *in_stack_ffffffffffffffb8;
  bool *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  this_00 = tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  tag_t<cfgfile::string_trait_t>::is_mandatory(in_RDI);
  std::
  make_shared<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>,std::__cxx11::string_const&,bool>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::
  shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>
  ::operator=((shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>
               *)this_00,in_stack_ffffffffffffffb8);
  std::
  shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>
  ::~shared_ptr((shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>
                 *)0x163303);
  peVar1 = std::
           __shared_ptr_access<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x163311);
  p = tag_t<cfgfile::string_trait_t>::parent(in_RDI);
  tag_t<cfgfile::string_trait_t>::set_parent(&peVar1->super_tag_t<cfgfile::string_trait_t>,p);
  peVar1 = std::
           __shared_ptr_access<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16333b);
  (*(peVar1->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[4])(peVar1,in_RSI);
  return;
}

Assistant:

void on_start( const parser_info_t< Trait > & info ) override
	{
		m_current = std::make_shared< T > ( this->name(), this->is_mandatory() );
		m_current->set_parent( this->parent() );
		m_current->on_start( info );
	}